

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<std::__cxx11::string,int,int,int,int>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
               int *args_2,int *args_3,int *args_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int *in_RSI;
  FormatListRef in_RDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  ostream *out_00;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  out_00 = (ostream *)&stack0xffffffffffffff70;
  makeFormatList<std::__cxx11::string,int,int,int,int>(in_RCX,in_R8,in_R9,(int *)out_00,in_RSI);
  vformat(out_00,(char *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}